

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
hmac_hash::sha1(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
               hmac_hash *this,void *data,size_t length)

{
  uchar *digest_00;
  size_t n;
  size_t n_00;
  EVP_PKEY_CTX *ctx_00;
  undefined1 local_70 [8];
  SHA1 ctx;
  allocator<unsigned_char> local_22;
  byte local_21;
  void *local_20;
  size_t length_local;
  void *data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *digest;
  
  local_21 = 0;
  local_20 = data;
  length_local = (size_t)this;
  data_local = __return_storage_ptr__;
  std::allocator<unsigned_char>::allocator(&local_22);
  ctx_00 = (EVP_PKEY_CTX *)0x14;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (__return_storage_ptr__,0x14,&local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  SHA1::SHA1((SHA1 *)local_70,(uchar *)ctx_00,n,(uchar *)length);
  SHA1::init((SHA1 *)local_70,ctx_00);
  SHA1::update((SHA1 *)local_70,(uchar *)length_local,(size_t)local_20);
  digest_00 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                        (__return_storage_ptr__);
  SHA1::finish((SHA1 *)local_70,digest_00);
  local_21 = 1;
  SHA1::~SHA1((SHA1 *)local_70,digest_00,n_00,(uchar *)length);
  if ((local_21 & 1) == 0) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<uint8_t> sha1(const void* data, size_t length) {
        std::vector<uint8_t> digest(hmac_hash::SHA1::DIGEST_SIZE);
        hmac_hash::SHA1 ctx;
        ctx.init();
        ctx.update(reinterpret_cast<const uint8_t*>(data), length);
        ctx.finish(digest.data());
        return digest;
    }